

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O2

void phosg::strip_multiline_comments<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               bool allow_unterminated)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  runtime_error *this;
  ulong uVar7;
  size_type __n;
  
  uVar7 = 0;
  __n = 0;
  bVar5 = false;
LAB_00110d5b:
  pcVar3 = (s->_M_dataplus)._M_p;
  uVar4 = s->_M_string_length;
LAB_00110d62:
  do {
    while( true ) {
      if (uVar4 <= uVar7) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (s,__n);
        if ((!allow_unterminated) && (bVar5)) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(this,"unterminated multiline comment");
          __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        return;
      }
      cVar2 = pcVar3[uVar7];
      if (bVar5) break;
      if (((cVar2 != '/') || (uVar4 <= uVar7 + 1)) || (pcVar3[uVar7 + 1] != '*')) {
        pcVar3[__n] = cVar2;
        goto LAB_00110dce;
      }
      bVar5 = true;
      uVar7 = uVar7 + 2;
    }
    if (cVar2 == '*') {
      if (uVar7 + 1 < uVar4) {
        lVar6 = uVar7 + 1;
        uVar1 = uVar7 + 2;
        uVar7 = uVar7 + 1;
        if (pcVar3[lVar6] == '/') {
          bVar5 = false;
          uVar7 = uVar1;
        }
        goto LAB_00110d62;
      }
    }
    else if (cVar2 == '\n') break;
    uVar7 = uVar7 + 1;
  } while( true );
  pcVar3[__n] = '\n';
LAB_00110dce:
  uVar7 = uVar7 + 1;
  __n = __n + 1;
  goto LAB_00110d5b;
}

Assistant:

void strip_multiline_comments(StrT& s, bool allow_unterminated = false) {
  bool is_in_comment = false;
  size_t write_offset = 0;
  for (size_t z = 0; z < s.size();) {
    if (!is_in_comment) {
      if ((s[z] == '/') && (z + 1 < s.size()) && (s[z + 1] == '*')) {
        is_in_comment = true;
        z += 2;
      } else {
        s[write_offset++] = s[z++];
      }
    } else {
      if ((s[z] == '*') && (z + 1 < s.size()) && (s[z + 1] == '/')) {
        is_in_comment = false;
        z += 2;
      } else {
        if (s[z++] == '\n') {
          s[write_offset++] = '\n';
        }
      }
    }
  }
  s.resize(write_offset);

  if (!allow_unterminated && is_in_comment) {
    throw std::runtime_error("unterminated multiline comment");
  }
}